

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_ge_set_gej_zinv(secp256k1_ge *r,secp256k1_gej *a,secp256k1_fe *zi)

{
  long in_RSI;
  long in_RDI;
  secp256k1_fe zi3;
  secp256k1_fe zi2;
  secp256k1_fe *in_stack_ffffffffffffff88;
  secp256k1_gej *in_stack_ffffffffffffff90;
  
  secp256k1_gej_verify(in_stack_ffffffffffffff90);
  secp256k1_fe_verify(&in_stack_ffffffffffffff90->x);
  if (*(int *)(in_RSI + 0x90) != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/group_impl.h"
            ,0x68,"test condition failed: !a->infinity");
    abort();
  }
  secp256k1_fe_sqr(&in_stack_ffffffffffffff90->x,in_stack_ffffffffffffff88);
  secp256k1_fe_mul(&in_stack_ffffffffffffff90->x,in_stack_ffffffffffffff88,(secp256k1_fe *)0x134ebc)
  ;
  secp256k1_fe_mul(&in_stack_ffffffffffffff90->x,in_stack_ffffffffffffff88,(secp256k1_fe *)0x134ed0)
  ;
  secp256k1_fe_mul(&in_stack_ffffffffffffff90->x,in_stack_ffffffffffffff88,(secp256k1_fe *)0x134eea)
  ;
  *(undefined4 *)(in_RDI + 0x60) = *(undefined4 *)(in_RSI + 0x90);
  secp256k1_ge_verify((secp256k1_ge *)in_stack_ffffffffffffff90);
  return;
}

Assistant:

static void secp256k1_ge_set_gej_zinv(secp256k1_ge *r, const secp256k1_gej *a, const secp256k1_fe *zi) {
    secp256k1_fe zi2;
    secp256k1_fe zi3;
    SECP256K1_GEJ_VERIFY(a);
    SECP256K1_FE_VERIFY(zi);
    VERIFY_CHECK(!a->infinity);

    secp256k1_fe_sqr(&zi2, zi);
    secp256k1_fe_mul(&zi3, &zi2, zi);
    secp256k1_fe_mul(&r->x, &a->x, &zi2);
    secp256k1_fe_mul(&r->y, &a->y, &zi3);
    r->infinity = a->infinity;

    SECP256K1_GE_VERIFY(r);
}